

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

void __thiscall duckdb_re2::NFA::NFA(NFA *this,Prog *prog)

{
  Prog *pPVar1;
  AddState *pAVar2;
  AddState *pAVar3;
  _Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter> _Var4;
  new_allocator<duckdb_re2::NFA::AddState> local_31;
  
  (this->q0_).size_ = 0;
  *(undefined8 *)
   &(this->q0_).sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
    _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> = 0;
  ((_Head_base<0UL,_int_*,_false> *)
  ((long)&(this->q0_).sparse_.ptr_._M_t.
          super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
          super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> + 8))->_M_head_impl =
       (int *)0x0;
  *(undefined8 *)
   &(this->q0_).dense_.ptr_._M_t.
    super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
       = 0;
  ((_Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false> *)
  ((long)&(this->q0_).dense_.ptr_._M_t.
          super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
  + 8))->_M_head_impl = (IndexValue *)0x0;
  (this->q1_).size_ = 0;
  *(undefined8 *)
   &(this->q1_).sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
    _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> = 0;
  ((_Head_base<0UL,_int_*,_false> *)
  ((long)&(this->q1_).sparse_.ptr_._M_t.
          super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
          super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> + 8))->_M_head_impl =
       (int *)0x0;
  *(undefined8 *)
   &(this->q1_).dense_.ptr_._M_t.
    super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
       = 0;
  ((_Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false> *)
  ((long)&(this->q1_).dense_.ptr_._M_t.
          super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
  + 8))->_M_head_impl = (IndexValue *)0x0;
  *(undefined8 *)
   &(this->stack_).ptr_._M_t.
    super___uniq_ptr_impl<duckdb_re2::NFA::AddState,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb_re2::NFA::AddState_*,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
       = 0;
  (this->stack_).ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::NFA::AddState,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_re2::NFA::AddState_*,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
  .super__Head_base<0UL,_duckdb_re2::NFA::AddState_*,_false>._M_head_impl = (AddState *)0x0;
  (this->arena_).
  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->arena_).
  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->arena_).
  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->arena_).
  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->arena_).
  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->arena_).
  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->arena_).
  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->arena_).
  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->arena_).
  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->arena_).
  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>::
  _M_initialize_map(&(this->arena_).
                     super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                    ,0);
  this->prog_ = prog;
  this->start_ = prog->start_;
  this->ncapture_ = 0;
  this->longest_ = false;
  this->endmatch_ = false;
  this->btext_ = (char *)0x0;
  this->etext_ = (char *)0x0;
  SparseArray<duckdb_re2::NFA::Thread_*>::resize(&this->q0_,prog->size_);
  SparseArray<duckdb_re2::NFA::Thread_*>::resize(&this->q1_,this->prog_->size_);
  pPVar1 = this->prog_;
  _Var4.super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter,_false>.
  _M_head_impl.len_ =
       (_Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter,_false>)
       (pPVar1->inst_count_[6] + pPVar1->inst_count_[3] * 2 + pPVar1->inst_count_[4] + 1);
  pAVar3 = __gnu_cxx::new_allocator<duckdb_re2::NFA::AddState>::allocate
                     (&local_31,
                      (long)(int)_Var4.
                                 super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter,_false>
                                 ._M_head_impl.len_,(void *)0x0);
  pAVar2 = (this->stack_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::NFA::AddState,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::NFA::AddState_*,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::NFA::AddState_*,_false>._M_head_impl;
  (this->stack_).ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::NFA::AddState,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_re2::NFA::AddState_*,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
  .super__Head_base<0UL,_duckdb_re2::NFA::AddState_*,_false>._M_head_impl = pAVar3;
  if (pAVar2 != (AddState *)0x0) {
    operator_delete(pAVar2);
  }
  (this->stack_).ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::NFA::AddState,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_re2::NFA::AddState_*,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
  .super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>.
  super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter,_false> =
       _Var4.super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter,_false>.
       _M_head_impl.len_;
  this->freelist_ = (Thread *)0x0;
  this->match_ = (char **)0x0;
  this->matched_ = false;
  return;
}

Assistant:

NFA::NFA(Prog* prog) {
  prog_ = prog;
  start_ = prog_->start();
  ncapture_ = 0;
  longest_ = false;
  endmatch_ = false;
  btext_ = NULL;
  etext_ = NULL;
  q0_.resize(prog_->size());
  q1_.resize(prog_->size());
  // See NFA::AddToThreadq() for why this is so.
  int nstack = 2*prog_->inst_count(kInstCapture) +
               prog_->inst_count(kInstEmptyWidth) +
               prog_->inst_count(kInstNop) + 1;  // + 1 for start inst
  stack_ = PODArray<AddState>(nstack);
  freelist_ = NULL;
  match_ = NULL;
  matched_ = false;
}